

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

void readTxa<TxaHeaderPS3>(istream *stream,TxaHeader *header)

{
  pointer pTVar1;
  pointer src;
  size_t len;
  ulong uVar2;
  pointer pTVar3;
  vector<char,_std::allocator<char>_> buffer;
  TxaChunkPS3 t_1;
  TxaHeaderPS3 h;
  vector<char,_std::allocator<char>_> local_88;
  string local_70;
  undefined1 local_50 [8];
  uint32_t local_48;
  uint local_44;
  uint32_t local_40;
  
  header->isSwitch = false;
  std::istream::read((char *)stream,(long)local_50);
  header->indexed = local_48;
  header->largestDecodedChunk = local_40;
  header->indexSize = 0;
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::resize(&header->chunks,(ulong)local_44);
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pTVar3 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar1) {
    do {
      std::istream::read((char *)stream,(long)&local_70);
      uVar2 = (ulong)local_70._M_dataplus._M_p & 0xffff;
      pTVar3->index = (uint16_t)((ulong)local_70._M_dataplus._M_p >> 0x10);
      pTVar3->width = (uint16_t)((ulong)local_70._M_dataplus._M_p >> 0x20);
      pTVar3->height = (uint16_t)((ulong)local_70._M_dataplus._M_p >> 0x30);
      pTVar3->offset = (uint32_t)local_70._M_string_length;
      pTVar3->length = (uint32_t)(local_70._M_string_length >> 0x20);
      pTVar3->decodedLength = 0;
      std::vector<char,_std::allocator<char>_>::resize(&local_88,uVar2 - 0xf);
      local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2 - 0x10] = '\0';
      std::istream::read((char *)stream,
                         (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      src = local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start;
      len = strlen(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      iconv_convert_abi_cxx11_(&local_70,src,len,iconv_toutf);
      std::__cxx11::string::operator=((string *)&pTVar3->name,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar1);
    if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void readTxa(std::istream& stream, TxaHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.indexed = h.indexed.value();
	header.largestDecodedChunk = h.largestDecodedChunk.value();
	header.indexSize = h.getIndexSize();
	header.chunks.resize(h.chunks.value());

	std::vector<char> buffer;

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.index = c.index.value();
		chunk.width = c.width.value();
		chunk.height = c.height.value();
		chunk.offset = c.entryOffset.value();
		chunk.length = c.entryLength.value();
		chunk.decodedLength = c.getDecLength();
		const size_t stringLength = c.headerLength.value() - sizeof(c);
		buffer.resize(stringLength + 1);
		buffer[stringLength] = 0;
		stream.read(buffer.data(), stringLength);
		chunk.name = toUTF8(buffer.data(), strlen(buffer.data()));
	}
}